

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O1

Error asmjit::v1_14::x86::FormatterInternal::formatRegister
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,RegType type,
                uint32_t id)

{
  uint uVar1;
  char c;
  FormatFlags FVar2;
  FormatFlags FVar3;
  Error EVar4;
  Error EVar5;
  Error EVar6;
  VirtReg *pVVar7;
  ulong uVar8;
  uint32_t uVar9;
  VirtReg *str;
  BaseEmitter *emitter_00;
  char *pcVar10;
  ulong uVar11;
  char c_00;
  undefined7 in_register_00000081;
  uint *puVar12;
  StringFormatFlags flags;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  
  puVar12 = (uint *)CONCAT71(in_register_00000081,type);
  uVar8 = (ulong)id;
  uVar13 = id - 0x100;
  uVar14 = (ulong)type;
  if ((emitter != (BaseEmitter *)0x0 && uVar13 < 0xfffffeff) && (emitter->_emitterType == kCompiler)
     ) {
    uVar1 = *(uint *)&emitter[3]._errorHandler;
    FVar2 = formatFlags;
    if (uVar13 < uVar1) {
      uVar11 = uVar8;
      pVVar7 = BaseCompiler::virtRegById((BaseCompiler *)emitter,id);
      if (pVVar7 == (VirtReg *)0x0) {
        formatRegister();
        uVar13 = *puVar12;
        FVar2 = (FormatFlags)uVar11;
        switch(uVar13 & 7) {
        case 1:
          EVar4 = formatRegister((String *)emitter,FVar2,emitter_00,kUnknown,(byte)uVar13 >> 3,
                                 puVar12[1]);
          return EVar4;
        case 2:
          goto switchD_00144386_caseD_2;
        default:
          EVar4 = String::_opString((String *)emitter,kAppend,"<None>",0xffffffffffffffff);
          return EVar4;
        case 4:
          uVar8 = *(ulong *)(puVar12 + 2);
          if (((uVar11 & 4) == 0) || (uVar8 < 10)) {
            uVar9 = 10;
            flags = kSigned;
          }
          else {
            EVar4 = String::_opString((String *)emitter,kAppend,"0x",2);
            if (EVar4 != 0) {
              return EVar4;
            }
            uVar9 = 0x10;
            flags = kNone;
          }
          EVar4 = String::_opNumber((String *)emitter,kAppend,uVar8,uVar9,0,flags);
          return EVar4;
        case 5:
          EVar4 = Formatter::formatLabel((String *)emitter,FVar2,emitter_00,puVar12[1]);
          return EVar4;
        }
      }
      if (*(uint *)(pVVar7 + 0x18) < 0xc) {
        str = pVVar7 + 0x1c;
      }
      else {
        str = *(VirtReg **)(pVVar7 + 0x20);
      }
      if ((str == (VirtReg *)0x0) || (*str == (VirtReg)0x0)) {
        FVar2 = String::_opFormat(sb,kAppend,"%%%u",(ulong)uVar13);
      }
      else {
        FVar2 = String::_opString(sb,kAppend,(char *)str,0xffffffffffffffff);
      }
      if (FVar2 == kNone) {
        bVar15 = true;
        if ((formatFlags & kRegType) == kNone) {
          if ((formatFlags & kRegCasts) == kNone) {
            bVar15 = false;
          }
          else {
            bVar15 = (byte)*pVVar7 >> 3 != type;
          }
        }
        if ((type < 0x20) && (bVar15)) {
          if ((ulong)(byte)x86RegFormatInfo[uVar14] == 0) {
            bVar15 = true;
          }
          else {
            FVar3 = String::_opFormat(sb,kAppend,"@%s",
                                      (ulong)(byte)x86RegFormatInfo[uVar14] + 0x159ad4);
            bVar15 = FVar3 == kNone;
            if (!bVar15) {
              FVar2 = FVar3;
            }
          }
          if (!bVar15) goto LAB_00144254;
        }
        FVar2 = kNone;
      }
    }
LAB_00144254:
    formatFlags = FVar2;
    if (uVar13 < uVar1) {
      return formatFlags;
    }
  }
  if (kMaxValue < type) goto LAB_00144311;
  if (id < (byte)x86RegFormatInfo[uVar14 * 4 + 0x83]) {
    formatFlags = String::_opString(sb,kAppend,
                                    x86RegFormatInfo +
                                    (ulong)(byte)x86RegFormatInfo[uVar14 * 4 + 0x82] + uVar8 * 4 +
                                    0x100,0xffffffffffffffff);
    bVar15 = false;
  }
  else {
    if (id < (byte)x86RegFormatInfo[uVar14 * 4 + 0x80]) {
      formatFlags = String::_opFormat(sb,kAppend,
                                      x86RegFormatInfo +
                                      (ulong)(byte)x86RegFormatInfo[uVar14 * 4 + 0x81] + 0x100,uVar8
                                     );
    }
    else {
      bVar15 = (ulong)(byte)x86RegFormatInfo[uVar14] == 0;
      if (bVar15) goto LAB_0014430c;
      formatFlags = String::_opFormat(sb,kAppend,"%s@%u",
                                      (ulong)(byte)x86RegFormatInfo[uVar14] + 0x159ad4,uVar8);
    }
    bVar15 = false;
  }
LAB_0014430c:
  if (!bVar15) {
    return formatFlags;
  }
LAB_00144311:
  EVar4 = String::_opFormat(sb,kAppend,"<Reg-%u>?%u",uVar14,uVar8);
  return EVar4;
switchD_00144386_caseD_2:
  uVar13 = uVar13 >> 0x18;
  switch(uVar13) {
  case 1:
    pcVar10 = "byte ptr ";
    break;
  case 2:
    pcVar10 = "word ptr ";
    break;
  case 3:
  case 5:
  case 7:
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
switchD_0014441c_caseD_3:
    pcVar10 = "";
    break;
  case 4:
    pcVar10 = "dword ptr ";
    break;
  case 6:
    pcVar10 = "fword ptr ";
    break;
  case 8:
    pcVar10 = "qword ptr ";
    break;
  case 10:
    pcVar10 = "tbyte ptr ";
    break;
  case 0x10:
    pcVar10 = "xmmword ptr ";
    break;
  default:
    if (uVar13 == 0x20) {
      pcVar10 = "ymmword ptr ";
    }
    else {
      if (uVar13 != 0x40) goto switchD_0014441c_caseD_3;
      pcVar10 = "zmmword ptr ";
    }
  }
  EVar4 = String::_opString((String *)emitter,kAppend,pcVar10,0xffffffffffffffff);
  if (EVar4 != 0) {
    return EVar4;
  }
  if (((*puVar12 >> 0x12 & 7) - 1 < 6) &&
     (EVar4 = String::_opFormat((String *)emitter,kAppend,"%s:"), EVar4 != 0)) {
    return EVar4;
  }
  EVar4 = String::_opChar((String *)emitter,kAppend,'[');
  if (EVar4 != 0) {
    return EVar4;
  }
  uVar13 = *puVar12 >> 0xe & 3;
  if (uVar13 == 2) {
    pcVar10 = "rel ";
LAB_0014458c:
    EVar4 = String::_opString((String *)emitter,kAppend,pcVar10,0xffffffffffffffff);
    if (EVar4 != 0) {
      return EVar4;
    }
  }
  else if (uVar13 == 1) {
    pcVar10 = "abs ";
    goto LAB_0014458c;
  }
  uVar13 = *puVar12 & 0xf8;
  EVar4 = 0;
  if (uVar13 == 0) {
    c_00 = '\0';
  }
  else if (uVar13 == 8) {
    EVar5 = Formatter::formatLabel((String *)emitter,FVar2,emitter_00,puVar12[1]);
    if (EVar5 != 0) {
      return EVar5;
    }
    c_00 = '+';
  }
  else {
    FVar3 = FVar2;
    if ((*puVar12 >> 0xd & 1) == 0) {
LAB_00144609:
      EVar6 = formatRegister((String *)emitter,FVar3,emitter_00,kUnknown,(byte)*puVar12 >> 3,
                             puVar12[1]);
      bVar15 = EVar6 == 0;
      EVar5 = EVar4;
      if (!bVar15) {
        EVar5 = EVar6;
      }
    }
    else {
      EVar5 = String::_opString((String *)emitter,kAppend,"&",0xffffffffffffffff);
      if (EVar5 == 0) {
        FVar3 = FVar2 & ~kRegCasts;
        goto LAB_00144609;
      }
      bVar15 = false;
    }
    c_00 = '+';
    EVar4 = EVar5;
    if (!bVar15) {
      return EVar5;
    }
  }
  if ((*puVar12 & 0x1f00) != 0) {
    if ((uVar13 != 0) && (EVar5 = String::_opChar((String *)emitter,kAppend,c_00), EVar5 != 0)) {
      return EVar5;
    }
    EVar5 = formatRegister((String *)emitter,FVar2,emitter_00,kUnknown,
                           (RegType)(*puVar12 >> 8) & kMaxValue,puVar12[2]);
    if (EVar5 != 0) {
      return EVar5;
    }
    c_00 = '+';
    if ((*puVar12 & 0x30000) != 0) {
      EVar5 = String::_opFormat((String *)emitter,kAppend,"*%u",
                                (ulong)(uint)(1 << ((byte)(*puVar12 >> 0x10) & 3)));
      c_00 = '+';
      if (EVar5 != 0) {
        return EVar5;
      }
    }
  }
  uVar8 = CONCAT44(puVar12[1],puVar12[3]);
  if ((*puVar12 & 0xf8) != 0) {
    uVar8 = (long)(int)puVar12[3];
  }
  if (((*puVar12 & 0x1ff8) != 0) && (uVar8 == 0)) goto LAB_00144782;
  uVar14 = -uVar8;
  if (0 < (long)uVar8) {
    uVar14 = uVar8;
  }
  c = '-';
  if (-1 < (long)uVar8) {
    c = c_00;
  }
  if ((c != '\0') && (EVar5 = String::_opChar((String *)emitter,kAppend,c), EVar5 != 0)) {
    return EVar5;
  }
  uVar9 = 10;
  if (((uVar11 & 8) == 0) || (uVar14 < 10)) {
LAB_0014475d:
    EVar5 = String::_opNumber((String *)emitter,kAppend,uVar14,uVar9,0,kNone);
    bVar15 = EVar5 == 0;
    if (!bVar15) {
      EVar4 = EVar5;
    }
  }
  else {
    EVar5 = String::_opString((String *)emitter,kAppend,"0x",2);
    if (EVar5 == 0) {
      uVar9 = 0x10;
      goto LAB_0014475d;
    }
    bVar15 = false;
    EVar4 = EVar5;
  }
  if (!bVar15) {
    return EVar4;
  }
LAB_00144782:
  EVar4 = String::_opChar((String *)emitter,kAppend,']');
  return EVar4;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatRegister(String& sb, FormatFlags formatFlags, const BaseEmitter* emitter, Arch arch, RegType type, uint32_t id) noexcept {
  DebugUtils::unused(arch);
  const RegFormatInfo& info = x86RegFormatInfo;

#ifndef ASMJIT_NO_COMPILER
  if (Operand::isVirtId(id)) {
    if (emitter && emitter->emitterType() == EmitterType::kCompiler) {
      const BaseCompiler* cc = static_cast<const BaseCompiler*>(emitter);
      if (cc->isVirtIdValid(id)) {
        VirtReg* vReg = cc->virtRegById(id);
        ASMJIT_ASSERT(vReg != nullptr);

        const char* name = vReg->name();
        if (name && name[0] != '\0')
          ASMJIT_PROPAGATE(sb.append(name));
        else
          ASMJIT_PROPAGATE(sb.appendFormat("%%%u", unsigned(Operand::virtIdToIndex(id))));

        bool formatType = (Support::test(formatFlags, FormatFlags::kRegType)) ||
                          (Support::test(formatFlags, FormatFlags::kRegCasts) && vReg->type() != type);

        if (formatType && uint32_t(type) <= uint32_t(RegType::kMaxValue)) {
          const RegFormatInfo::TypeEntry& typeEntry = info.typeEntries[size_t(type)];
          if (typeEntry.index)
            ASMJIT_PROPAGATE(sb.appendFormat("@%s", info.typeStrings + typeEntry.index));
        }

        return kErrorOk;
      }
    }
  }
#else
  DebugUtils::unused(emitter, formatFlags);
#endif

  if (uint32_t(type) <= uint32_t(RegType::kMaxValue)) {
    const RegFormatInfo::NameEntry& nameEntry = info.nameEntries[size_t(type)];

    if (id < nameEntry.specialCount)
      return sb.append(info.nameStrings + nameEntry.specialIndex + id * 4);

    if (id < nameEntry.count)
      return sb.appendFormat(info.nameStrings + nameEntry.formatIndex, unsigned(id));

    const RegFormatInfo::TypeEntry& typeEntry = info.typeEntries[size_t(type)];
    if (typeEntry.index)
      return sb.appendFormat("%s@%u", info.typeStrings + typeEntry.index, id);
  }

  return sb.appendFormat("<Reg-%u>?%u", uint32_t(type), id);
}